

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOptFields.cpp
# Opt level: O2

void __thiscall
GlobOpt::KillObjectHeaderInlinedTypeSyms
          (GlobOpt *this,BasicBlock *block,bool isObjTypeSpecialized,SymID opndId)

{
  Type TVar1;
  EquivalentTypeSet *this_00;
  long lVar2;
  code *pcVar3;
  bool bVar4;
  TypeId TVar5;
  undefined4 *puVar6;
  Value *pVVar7;
  JsTypeValueInfo *pJVar8;
  JITType *pJVar9;
  JITTypeHandler *pJVar10;
  SymID typeSymId;
  uint16 i;
  uint16 index;
  anon_class_8_1_8991fb9c local_68;
  BVUnitT<unsigned_long> local_60;
  SparseBVUnit _unit;
  BVSparse<Memory::JitArenaAllocator> *local_50;
  JITTypeHolderBase<void> local_40;
  JITTypeHolder type;
  
  local_50 = this->objectTypeSyms;
  if (local_50 != (BVSparse<Memory::JitArenaAllocator> *)0x0) {
    _unit.word = (Type)&block->globOptData;
    local_68.this = this;
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    while (local_50 = (BVSparse<Memory::JitArenaAllocator> *)local_50->head,
          local_50 != (BVSparse<Memory::JitArenaAllocator> *)0x0) {
      TVar1 = *(Type *)&local_50->lastFoundIndex;
      local_60.word = ((Type *)&local_50->alloc)->word;
      while (local_60.word != 0) {
        lVar2 = 0;
        if (local_60.word != 0) {
          for (; (local_60.word >> lVar2 & 1) == 0; lVar2 = lVar2 + 1) {
          }
        }
        typeSymId = TVar1 + (BVIndex)lVar2;
        BVUnitT<unsigned_long>::Clear(&local_60,(BVIndex)lVar2);
        if ((!isObjTypeSpecialized || typeSymId != opndId) &&
           (pVVar7 = GlobOptBlockData::FindObjectTypeValue((GlobOptBlockData *)_unit.word,typeSymId)
           , pVVar7 != (Value *)0x0)) {
          pJVar8 = ValueInfo::AsJsType(pVVar7->valueInfo);
          if (pJVar8 == (JsTypeValueInfo *)0x0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar6 = 1;
            bVar4 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptFields.cpp"
                               ,0x3f7,"(valueInfo)","valueInfo");
            if (!bVar4) {
              pcVar3 = (code *)invalidInstructionException();
              (*pcVar3)();
            }
            *puVar6 = 0;
          }
          local_40.t = (pJVar8->jsType).t;
          type.t = (Type)0x0;
          bVar4 = JITTypeHolderBase<void>::operator!=(&local_40,&type.t);
          if (bVar4) {
            local_40.t = (pJVar8->jsType).t;
            pJVar9 = JITTypeHolderBase<void>::operator->(&local_40);
            TVar5 = JITType::GetTypeId(pJVar9);
            bVar4 = Js::DynamicType::Is(TVar5);
            if (bVar4) {
              pJVar9 = JITTypeHolderBase<void>::operator->(&local_40);
              pJVar10 = JITType::GetTypeHandler(pJVar9);
              bVar4 = JITTypeHandler::IsObjectHeaderInlinedTypeHandler(pJVar10);
              if (bVar4) {
LAB_0046afc1:
                KillObjectHeaderInlinedTypeSyms::anon_class_8_1_8991fb9c::operator()
                          (&local_68,typeSymId);
              }
            }
          }
          else {
            this_00 = pJVar8->jsTypeSet;
            if (this_00 != (EquivalentTypeSet *)0x0) {
              for (index = 0; index < this_00->count; index = index + 1) {
                local_40.t = (Type)Js::EquivalentTypeSet::GetType(this_00,index);
                type.t = (Type)0x0;
                bVar4 = JITTypeHolderBase<void>::operator!=(&local_40,&type.t);
                if (bVar4) {
                  pJVar9 = JITTypeHolderBase<void>::operator->(&local_40);
                  TVar5 = JITType::GetTypeId(pJVar9);
                  bVar4 = Js::DynamicType::Is(TVar5);
                  if (bVar4) {
                    pJVar9 = JITTypeHolderBase<void>::operator->(&local_40);
                    pJVar10 = JITType::GetTypeHandler(pJVar9);
                    bVar4 = JITTypeHandler::IsObjectHeaderInlinedTypeHandler(pJVar10);
                    if (bVar4) goto LAB_0046afc1;
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

void
GlobOpt::KillObjectHeaderInlinedTypeSyms(BasicBlock *block, bool isObjTypeSpecialized, SymID opndId)
{
    this->MapObjectHeaderInlinedTypeSymsUntil(block, isObjTypeSpecialized, opndId, [&](SymID symId)->bool  { this->currentBlock->globOptData.liveFields->Clear(symId); return false; });
}